

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PortBackref * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ValueSymbol::PortBackref,slang::ast::PortSymbol_const&,slang::ast::ValueSymbol::PortBackref_const*&>
          (BumpAllocator *this,PortSymbol *args,PortBackref **args_1)

{
  PortBackref *pPVar1;
  PortBackref *pPVar2;
  
  pPVar2 = (PortBackref *)allocate(this,0x10,8);
  pPVar1 = *args_1;
  (pPVar2->port).ptr = args;
  pPVar2->next = pPVar1;
  return pPVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }